

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O0

void Lpk_DecomposeClean(Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  int iVar1;
  Lpk_Fun_t *p;
  undefined4 local_24;
  int i;
  Lpk_Fun_t *pFunc;
  int nLeavesOld_local;
  Vec_Ptr_t *vLeaves_local;
  
  for (local_24 = nLeavesOld; iVar1 = Vec_PtrSize(vLeaves), local_24 < iVar1;
      local_24 = local_24 + 1) {
    p = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,local_24);
    Lpk_FunFree(p);
  }
  Vec_PtrShrink(vLeaves,nLeavesOld);
  return;
}

Assistant:

void Lpk_DecomposeClean( Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Lpk_Fun_t * pFunc;
    int i;
    Vec_PtrForEachEntryStart( Lpk_Fun_t *, vLeaves, pFunc, i, nLeavesOld )
        Lpk_FunFree( pFunc );
    Vec_PtrShrink( vLeaves, nLeavesOld );
}